

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O2

sha256_hash *
libtorrent::merkle_root_scratch
          (sha256_hash *__return_storage_ptr__,span<const_libtorrent::digest32<256L>_> leaves,
          int num_leafs,sha256_hash pad,
          vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          *scratch_space)

{
  uint *puVar1;
  pointer pdVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  hasher256 *phVar8;
  long lVar9;
  pointer pdVar10;
  ulong uVar11;
  span<const_char> data;
  span<const_char> data_00;
  span<const_char> data_01;
  span<const_char> data_02;
  span<const_char> data_03;
  span<const_char> data_04;
  ulong local_78;
  hasher256 local_70;
  uint local_64;
  sha256_hash local_60;
  sha256_hash *local_40;
  pointer local_38;
  
  local_78 = leaves.m_len;
  pdVar10 = leaves.m_ptr;
  ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::resize
            (scratch_space,local_78 + 1 >> 1);
  if (num_leafs == 1) {
    uVar4 = *(undefined8 *)(pdVar10->m_number)._M_elems;
    uVar5 = *(undefined8 *)((pdVar10->m_number)._M_elems + 2);
    uVar6 = *(undefined8 *)((pdVar10->m_number)._M_elems + 6);
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 4) =
         *(undefined8 *)((pdVar10->m_number)._M_elems + 4);
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 6) = uVar6;
    *(undefined8 *)(__return_storage_ptr__->m_number)._M_elems = uVar4;
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 2) = uVar5;
  }
  else {
    local_40 = __return_storage_ptr__;
    while (1 < num_leafs) {
      uVar3 = (long)((ulong)(uint)((int)local_78 >> 0x1f) << 0x20 | local_78 & 0xffffffff) / 2;
      uVar11 = uVar3 & 0xffffffff;
      if ((int)uVar3 < 1) {
        uVar11 = 0;
      }
      local_64 = num_leafs;
      local_38 = pdVar10;
      for (lVar9 = 0; uVar11 * 0x20 != lVar9; lVar9 = lVar9 + 0x20) {
        lcrypto::hasher256::hasher256(&local_70);
        data.m_len = 0x20;
        data.m_ptr = (char *)pdVar10;
        phVar8 = lcrypto::hasher256::update(&local_70,data);
        data_00.m_len = 0x20;
        data_00.m_ptr = (char *)(pdVar10 + 1);
        phVar8 = lcrypto::hasher256::update(phVar8,data_00);
        lcrypto::hasher256::final(&local_60,phVar8);
        pdVar2 = (scratch_space->
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (uint *)((long)(pdVar2->m_number)._M_elems + lVar9 + 0x10);
        *(undefined8 *)puVar1 = local_60.m_number._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_60.m_number._M_elems._24_8_;
        puVar1 = (uint *)((long)(pdVar2->m_number)._M_elems + lVar9);
        *(undefined8 *)puVar1 = local_60.m_number._M_elems._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_60.m_number._M_elems._8_8_;
        lcrypto::hasher256::~hasher256(&local_70);
        pdVar10 = pdVar10 + 2;
      }
      uVar3 = local_78 & 1;
      local_78 = uVar11;
      if (uVar3 != 0) {
        lcrypto::hasher256::hasher256(&local_70);
        data_01.m_ptr = local_38 + (uint)((int)uVar11 * 2);
        data_01.m_len = 0x20;
        phVar8 = lcrypto::hasher256::update(&local_70,data_01);
        data_02.m_len = 0x20;
        data_02.m_ptr = (char *)&pad;
        phVar8 = lcrypto::hasher256::update(phVar8,data_02);
        lcrypto::hasher256::final(&local_60,phVar8);
        pdVar10 = (scratch_space->
                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        puVar1 = pdVar10[uVar11].m_number._M_elems + 4;
        *(undefined8 *)puVar1 = local_60.m_number._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_60.m_number._M_elems._24_8_;
        pdVar10 = pdVar10 + uVar11;
        *(undefined8 *)(pdVar10->m_number)._M_elems = local_60.m_number._M_elems._0_8_;
        *(undefined8 *)((pdVar10->m_number)._M_elems + 2) = local_60.m_number._M_elems._8_8_;
        lcrypto::hasher256::~hasher256(&local_70);
        local_78 = (ulong)((int)uVar11 + 1);
      }
      lcrypto::hasher256::hasher256(&local_70);
      data_03.m_len = 0x20;
      data_03.m_ptr = (char *)&pad;
      phVar8 = lcrypto::hasher256::update(&local_70,data_03);
      uVar7 = local_64;
      data_04.m_len = 0x20;
      data_04.m_ptr = (char *)&pad;
      phVar8 = lcrypto::hasher256::update(phVar8,data_04);
      lcrypto::hasher256::final(&local_60,phVar8);
      pad.m_number._M_elems[4] = local_60.m_number._M_elems[4];
      pad.m_number._M_elems[5] = local_60.m_number._M_elems[5];
      pad.m_number._M_elems[6] = local_60.m_number._M_elems[6];
      pad.m_number._M_elems[7] = local_60.m_number._M_elems[7];
      pad.m_number._M_elems[0] = local_60.m_number._M_elems[0];
      pad.m_number._M_elems[1] = local_60.m_number._M_elems[1];
      pad.m_number._M_elems[2] = local_60.m_number._M_elems[2];
      pad.m_number._M_elems[3] = local_60.m_number._M_elems[3];
      lcrypto::hasher256::~hasher256(&local_70);
      pdVar10 = (scratch_space->
                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      num_leafs = uVar7 >> 1;
    }
    pdVar10 = (scratch_space->
              super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = *(undefined8 *)(pdVar10->m_number)._M_elems;
    uVar5 = *(undefined8 *)((pdVar10->m_number)._M_elems + 2);
    uVar6 = *(undefined8 *)((pdVar10->m_number)._M_elems + 6);
    *(undefined8 *)((local_40->m_number)._M_elems + 4) =
         *(undefined8 *)((pdVar10->m_number)._M_elems + 4);
    *(undefined8 *)((local_40->m_number)._M_elems + 6) = uVar6;
    *(undefined8 *)(local_40->m_number)._M_elems = uVar4;
    *(undefined8 *)((local_40->m_number)._M_elems + 2) = uVar5;
    __return_storage_ptr__ = local_40;
  }
  return __return_storage_ptr__;
}

Assistant:

sha256_hash merkle_root_scratch(span<sha256_hash const> leaves
		, int num_leafs, sha256_hash pad
		, std::vector<sha256_hash>& scratch_space)
	{
		TORRENT_ASSERT(((num_leafs - 1) & num_leafs) == 0);

		scratch_space.resize(std::size_t(leaves.size() + 1) / 2);
		TORRENT_ASSERT(num_leafs > 0);

		if (num_leafs == 1) return leaves[0];

		while (num_leafs > 1)
		{
			int i = 0;
			for (; i < int(leaves.size()) / 2; ++i)
			{
				scratch_space[std::size_t(i)] = hasher256()
					.update(leaves[i * 2])
					.update(leaves[i * 2 + 1])
					.final();
			}
			if (leaves.size() & 1)
			{
				// if we have an odd number of leaves, compute the boundary hash
				// here, that spans both a payload-hash and a pad hash
				scratch_space[std::size_t(i)] = hasher256()
					.update(leaves[i * 2])
					.update(pad)
					.final();
				++i;
			}
			// we don't have to copy any pad hashes into memory, they are implied
			// just keep track of the current layer's pad hash
			pad = hasher256().update(pad).update(pad).final();

			// step one level up
			leaves = span<sha256_hash const>(scratch_space.data(), i);
			num_leafs /= 2;
		}

		return scratch_space[0];
	}